

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O0

ON_OffsetSurface * __thiscall
ON_OffsetSurface::operator=(ON_OffsetSurface *this,ON_OffsetSurface *src)

{
  ON_Surface *pOVar1;
  ON_OffsetSurface *src_local;
  ON_OffsetSurface *this_local;
  
  if (this != src) {
    if (((this->m__pSrf != (ON_Surface *)0x0) && (this != (ON_OffsetSurface *)this->m__pSrf)) &&
       (this->m__pSrf != (ON_Surface *)0x0)) {
      (*(this->m__pSrf->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    }
    this->m__pSrf = (ON_Surface *)0x0;
    if (src->m__pSrf == (ON_Surface *)0x0) {
      ON_SurfaceProxy::operator=(&this->super_ON_SurfaceProxy,&src->super_ON_SurfaceProxy);
    }
    else {
      pOVar1 = ON_SurfaceProxy::DuplicateSurface(&src->super_ON_SurfaceProxy);
      this->m__pSrf = pOVar1;
      ON_SurfaceProxy::SetProxySurface(&this->super_ON_SurfaceProxy,this->m__pSrf);
    }
    ON_OffsetSurfaceFunction::operator=(&this->m_offset_function,&src->m_offset_function);
    pOVar1 = BaseSurface(this);
    ON_OffsetSurfaceFunction::SetBaseSurface(&this->m_offset_function,pOVar1);
  }
  return this;
}

Assistant:

ON_OffsetSurface& ON_OffsetSurface::operator=(const ON_OffsetSurface& src)
{
  if ( this != &src )
  {
    if ( 0 != m__pSrf && this != m__pSrf )
      delete m__pSrf;
    m__pSrf = 0;
    if ( 0 != src.m__pSrf )
    {
      m__pSrf = src.ON_SurfaceProxy::DuplicateSurface();
      SetProxySurface(m__pSrf);
    }
    else
    {
      ON_SurfaceProxy::operator=(src);
    }
    m_offset_function = src.m_offset_function;
    m_offset_function.SetBaseSurface( BaseSurface() );
  }
  return *this;
}